

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhRecordAppend(lhcell *pCell,void *pData,unqlite_int64 nByte)

{
  sxu16 iOfft_00;
  uint local_b4;
  undefined1 local_b0 [4];
  sxu32 nLen;
  SyBlob sWorker;
  sxu16 local_86;
  sxu32 iOld;
  sxu16 iOldOfft;
  sxu16 iOfft;
  int rc;
  pgno iOvfl;
  ulong uStack_70;
  sxu32 nAvail;
  sxu64 nDatalen;
  unqlite_page *pNew;
  unqlite_page *pOvfl;
  uchar *zRawEnd;
  uchar *zRaw;
  lhpage *pPage;
  uchar *zEnd;
  uchar *zPtr;
  lhash_kv_engine *pEngine;
  unqlite_int64 nByte_local;
  void *pData_local;
  lhcell *pCell_local;
  
  zPtr = (uchar *)pCell->pPage->pHash;
  zRaw = (uchar *)pCell->pPage;
  pEngine = (lhash_kv_engine *)nByte;
  nByte_local = (unqlite_int64)pData;
  pData_local = pCell;
  if (pCell->nData + nByte < pCell->nData) {
    (*((lhash_kv_engine *)zPtr)->pIo->xErr)
              (((lhash_kv_engine *)zPtr)->pIo->pHandle,"Append operation will cause data overflow");
    pCell_local._4_4_ = 0xfffffff9;
  }
  else {
    iOld = (*((lhash_kv_engine *)zPtr)->pIo->xWrite)(((lhpage *)zRaw)->pRaw);
    pCell_local._4_4_ = iOld;
    if (iOld == 0) {
      if (*(long *)((long)pData_local + 0x18) == 0) {
        local_86 = 0;
        iOld = lhAllocateSpace((lhpage *)zRaw,
                               (long)(pEngine->sAllocator).apPool +
                               (ulong)(*(int *)((long)pData_local + 4) + 0x1a) +
                               *(long *)((long)pData_local + 8) + -0x48,&local_86);
        if (iOld == 0) {
          iOfft_00 = *(sxu16 *)((long)pData_local + 0x28);
          sWorker._28_4_ = SUB84(*(undefined8 *)((long)pData_local + 8),0);
          SyBlobInit((SyBlob *)local_b0,(SyMemBackend *)(zPtr + 8));
          iOld = SyBlobAppend((SyBlob *)local_b0,
                              (void *)(**(long **)(zRaw + 8) +
                                      (ulong)(*(ushort *)((long)pData_local + 0x28) + 0x1a +
                                             *(int *)((long)pData_local + 4))),
                              (sxu32)*(undefined8 *)((long)pData_local + 8));
          if (iOld == 0) {
            iOld = SyBlobAppend((SyBlob *)local_b0,(void *)nByte_local,(sxu32)pEngine);
          }
          if (iOld != 0) {
            SyBlobRelease((SyBlob *)local_b0);
            return iOld;
          }
          lhMoveLocalCell((lhcell *)pData_local,local_86,sWorker.pAllocator,
                          (ulong)(uint)sWorker.pBlob);
          lhRestoreSpace((lhpage *)zRaw,iOfft_00,
                         (short)*(undefined4 *)((long)pData_local + 4) + 0x1a + sWorker._28_2_);
          SyBlobRelease((SyBlob *)local_b0);
        }
        else {
          iOld = lhCellWriteOvflPayload
                           ((lhcell *)pData_local,
                            (void *)(**(long **)(zRaw + 8) +
                                    (long)(int)(*(ushort *)((long)pData_local + 0x28) + 0x1a)),
                            *(sxu32 *)((long)pData_local + 4),
                            **(long **)(zRaw + 8) +
                            (ulong)(*(ushort *)((long)pData_local + 0x28) + 0x1a +
                                   *(int *)((long)pData_local + 4)),
                            *(undefined8 *)((long)pData_local + 8),nByte_local,pEngine,0);
          if (iOld != 0) {
            return iOld;
          }
          SyBigEndianPack64((uchar *)(**(long **)(zRaw + 8) +
                                     (long)(int)(*(ushort *)((long)pData_local + 0x28) + 8)),
                            (long)(pEngine->sAllocator).apPool +
                            *(long *)((long)pData_local + 8) + -0x48);
          lhRestoreSpace((lhpage *)zRaw,*(short *)((long)pData_local + 0x28) + 0x1a,
                         (short)*(undefined4 *)((long)pData_local + 4) +
                         (short)*(undefined8 *)((long)pData_local + 8));
          *(long *)((long)pData_local + 8) =
               (long)(pEngine->sAllocator).apPool + *(long *)((long)pData_local + 8) + -0x48;
        }
        pCell_local._4_4_ = 0;
      }
      else {
        iOld = (**(code **)(*(long *)zPtr + 0x10))
                         (**(undefined8 **)zPtr,*(undefined8 *)((long)pData_local + 0x30),&pNew);
        pCell_local._4_4_ = iOld;
        if (iOld == 0) {
          SyBigEndianUnpack64(pNew->zData,(sxu64 *)&iOldOfft);
          zRawEnd = pNew->zData + *(ushort *)((long)pData_local + 0x38);
          pOvfl = (unqlite_page *)(pNew->zData + *(int *)(zPtr + 0x110));
          uStack_70 = *(ulong *)((long)pData_local + 8);
          iOvfl._4_4_ = (int)pOvfl - (int)zRawEnd;
          while( true ) {
            if (pOvfl <= zRawEnd) {
              if (_iOldOfft == 0) {
                (**(code **)(*(long *)zPtr + 0x80))(**(undefined8 **)zPtr,"Corrupt overflow page");
                return -0x18;
              }
              iOld = (**(code **)(*(long *)zPtr + 0x10))(**(undefined8 **)zPtr,_iOldOfft,&nDatalen);
              if (iOld != 0) {
                return iOld;
              }
              SyBigEndianUnpack64(*(uchar **)nDatalen,(sxu64 *)&iOldOfft);
              (**(code **)(*(long *)zPtr + 0x50))(pNew);
              zRawEnd = (uchar *)(*(long *)nDatalen + 8);
              pOvfl = (unqlite_page *)
                      (*(long *)nDatalen +
                      (long)*(int *)(**(long **)((long)pData_local + 0x20) + 0x110));
              iOvfl._4_4_ = *(int *)(**(long **)((long)pData_local + 0x20) + 0x110) - 8;
              pNew = (unqlite_page *)nDatalen;
            }
            if (uStack_70 < iOvfl._4_4_) break;
            uStack_70 = uStack_70 - iOvfl._4_4_;
            zRawEnd = zRawEnd + iOvfl._4_4_;
          }
          zRawEnd = zRawEnd + uStack_70;
          zEnd = (uchar *)nByte_local;
          pPage = (lhpage *)((long)(pEngine->sAllocator).apPool + nByte_local + -0x48);
          pCell_local._4_4_ = (**(code **)(*(long *)zPtr + 0x28))(pNew);
          if (pCell_local._4_4_ == 0) {
            iOld = 0;
            for (; zEnd < pPage; zEnd = zEnd + local_b4) {
              if (pOvfl <= zRawEnd) {
                iOld = lhAcquirePage((lhash_kv_engine *)zPtr,(unqlite_page **)&nDatalen);
                if (iOld != 0) {
                  return iOld;
                }
                iOld = (**(code **)(*(long *)zPtr + 0x28))(nDatalen);
                if (iOld != 0) {
                  return iOld;
                }
                SyBigEndianPack64(pNew->zData,*(sxu64 *)(nDatalen + 0x10));
                (**(code **)(*(long *)zPtr + 0x50))(pNew);
                SyBigEndianPack64(*(uchar **)nDatalen,0);
                pNew = (unqlite_page *)nDatalen;
                zRawEnd = (uchar *)(*(long *)nDatalen + 8);
                pOvfl = (unqlite_page *)(*(long *)nDatalen + (long)*(int *)(zPtr + 0x110));
              }
              iOvfl._4_4_ = (int)pOvfl - (int)zRawEnd;
              local_b4 = (int)pPage - (int)zEnd;
              if (iOvfl._4_4_ < local_b4) {
                local_b4 = iOvfl._4_4_;
              }
              SyMemcpy(zEnd,zRawEnd,local_b4);
              zRawEnd = zRawEnd + local_b4;
            }
            (**(code **)(*(long *)zPtr + 0x50))(pNew);
            *(long *)((long)pData_local + 8) =
                 (long)(pEngine->sAllocator).apPool + *(long *)((long)pData_local + 8) + -0x48;
            SyBigEndianPack64((uchar *)(**(long **)(zRaw + 8) +
                                       (long)(int)(*(ushort *)((long)pData_local + 0x28) + 8)),
                              *(sxu64 *)((long)pData_local + 8));
            pCell_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return pCell_local._4_4_;
}

Assistant:

static int lhRecordAppend(
	lhcell *pCell,
	const void *pData,unqlite_int64 nByte
	)
{
	lhash_kv_engine *pEngine = pCell->pPage->pHash;
	const unsigned char *zPtr,*zEnd;
	lhpage *pPage = pCell->pPage;
	unsigned char *zRaw,*zRawEnd;
	unqlite_page *pOvfl,*pNew;
	sxu64 nDatalen;
	sxu32 nAvail;
	pgno iOvfl;
	int rc;
	if( pCell->nData + nByte < pCell->nData ){
		/* Overflow */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Append operation will cause data overflow");
		return UNQLITE_LIMIT;
	}
	/* Acquire a writer lock on this page */
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pCell->iOvfl == 0 ){
		sxu16 iOfft = 0; /* cc warning */
		/* Local payload, check for a bigger place */
		rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ + pCell->nKey + pCell->nData + nByte,&iOfft);
		if( rc != UNQLITE_OK ){
			/* Transfer the payload to an overflow page */
			rc = lhCellWriteOvflPayload(pCell,
				&pPage->pRaw->zData[pCell->iStart + L_HASH_CELL_SZ],pCell->nKey,
				(const void *)&pPage->pRaw->zData[pCell->iStart + L_HASH_CELL_SZ + pCell->nKey],pCell->nData,
				pData,nByte,
				(const void *)0);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Update the cell header */
			SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4 /* Hash */ + 4 /* Key */],pCell->nData + nByte);
			/* Restore freespace */
			lhRestoreSpace(pPage,(sxu16)(pCell->iStart + L_HASH_CELL_SZ),(sxu16)(pCell->nKey + pCell->nData));
			/* New data size */
			pCell->nData += nByte;
		}else{
			sxu16 iOldOfft = pCell->iStart;
			sxu32 iOld = (sxu32)pCell->nData;
			SyBlob sWorker;
			SyBlobInit(&sWorker,&pEngine->sAllocator);
			/* Copy the old data */
			rc = SyBlobAppend(&sWorker,(const void *)&pPage->pRaw->zData[pCell->iStart + L_HASH_CELL_SZ + pCell->nKey],(sxu32)pCell->nData);
			if( rc == SXRET_OK ){
				/* Append the new data */
				rc = SyBlobAppend(&sWorker,pData,(sxu32)nByte);
			}
			if( rc != UNQLITE_OK ){
				SyBlobRelease(&sWorker);
				return rc;
			}
			/* Space is available, transfer the cell */
			lhMoveLocalCell(pCell,iOfft,SyBlobData(&sWorker),(unqlite_int64)SyBlobLength(&sWorker));
			/* Restore cell space */
			lhRestoreSpace(pPage,iOldOfft,(sxu16)(L_HASH_CELL_SZ + pCell->nKey + iOld));
			/* All done */
			SyBlobRelease(&sWorker);
		}
		return UNQLITE_OK;
	}
	/* Point to the overflow page which hold the data */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pCell->iDataPage,&pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Next overflow page in the chain */
	SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
	/* Point to the end of the chunk */
	zRaw = &pOvfl->zData[pCell->iDataOfft];
	zRawEnd = &pOvfl->zData[pEngine->iPageSize];
	nDatalen = pCell->nData;
	nAvail = (sxu32)(zRawEnd - zRaw);
	for(;;){
		if( zRaw >= zRawEnd ){
			if( iOvfl == 0 ){
				/* Cant happen */
				pEngine->pIo->xErr(pEngine->pIo->pHandle,"Corrupt overflow page");
				return UNQLITE_CORRUPT;
			}
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Next overflow page on the chain */
			SyBigEndianUnpack64(pNew->zData,&iOvfl);
			/* Unref the previous overflow page */
			pEngine->pIo->xPageUnref(pOvfl);
			/* Point to the new chunk */
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pCell->pPage->pHash->iPageSize];
			nAvail = L_HASH_OVERFLOW_SIZE(pCell->pPage->pHash->iPageSize);
			pOvfl = pNew;
		}
		if( (sxu64)nAvail > nDatalen ){
			zRaw += nDatalen;
			break;
		}else{
			nDatalen -= nAvail;
		}
		zRaw += nAvail;
	}
	/* Start the append process */
	zPtr = (const unsigned char *)pData;
	zEnd = &zPtr[nByte];
	/* Acquire a writer lock */
	rc = pEngine->pIo->xWrite(pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	for(;;){
		sxu32 nLen;
		if( zPtr >= zEnd ){
			break;
		}
		if( zRaw >= zRawEnd ){
			/* Acquire a new page */
			rc = lhAcquirePage(pEngine,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			rc = pEngine->pIo->xWrite(pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Link */
			SyBigEndianPack64(pOvfl->zData,pNew->iPage);
			pEngine->pIo->xPageUnref(pOvfl);
			SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
			pOvfl = pNew;
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pEngine->iPageSize];
		}
		nAvail = (sxu32)(zRawEnd-zRaw);
		nLen = (sxu32)(zEnd-zPtr);
		if( nLen > nAvail ){
			nLen = nAvail;
		}
		SyMemcpy((const void *)zPtr,(void *)zRaw,nLen);
		/* Synchronize pointers */
		zPtr += nLen;
		zRaw += nLen;
	}
	/* Unref the last overflow page */
	pEngine->pIo->xPageUnref(pOvfl);
	/* Finally, update the cell header */
	pCell->nData += nByte;
	SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4 /* Hash */ + 4 /* Key */],pCell->nData);
	/* All done */
	return UNQLITE_OK;
}